

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O0

void __thiscall rlottie::internal::model::Stroke::Stroke(Stroke *this)

{
  Property<float,_void> *in_RDI;
  Property<rlottie::internal::model::Color,_void> *unaff_retaddr;
  float in_stack_ffffffffffffffec;
  
  Object::Object((Object *)in_RDI,Stroke);
  Property<rlottie::internal::model::Color,_void>::Property(unaff_retaddr);
  Property<float,_void>::Property(in_RDI,in_stack_ffffffffffffffec);
  Property<float,_void>::Property(in_RDI,in_stack_ffffffffffffffec);
  in_RDI[4].isValue_ = false;
  in_RDI[4].field_0x9 = 0;
  *(undefined4 *)&in_RDI[4].field_0xc = 0;
  Dash::Dash((Dash *)0x19e0e0);
  in_RDI[6].isValue_ = true;
  return;
}

Assistant:

Stroke() : Object(Object::Type::Stroke) {}